

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O0

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,int labelwidth,int entrywidth)

{
  unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_> *this_00;
  int local_70 [2];
  unique_ptr<cmCursesStringWidget,_std::default_delete<cmCursesStringWidget>_> local_68;
  char local_60 [4];
  int local_5c [3];
  unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_44;
  int local_20;
  int local_1c;
  int entrywidth_local;
  int labelwidth_local;
  string *key_local;
  cmCursesCacheEntryComposite *this_local;
  
  local_20 = entrywidth;
  local_1c = labelwidth;
  _entrywidth_local = key;
  key_local = (string *)this;
  std::unique_ptr<cmCursesLabelWidget,std::default_delete<cmCursesLabelWidget>>::
  unique_ptr<std::default_delete<cmCursesLabelWidget>,void>
            ((unique_ptr<cmCursesLabelWidget,std::default_delete<cmCursesLabelWidget>> *)this);
  std::unique_ptr<cmCursesLabelWidget,std::default_delete<cmCursesLabelWidget>>::
  unique_ptr<std::default_delete<cmCursesLabelWidget>,void>
            ((unique_ptr<cmCursesLabelWidget,std::default_delete<cmCursesLabelWidget>> *)
             &this->IsNewLabel);
  std::unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>>::
  unique_ptr<std::default_delete<cmCursesWidget>,void>
            ((unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>> *)&this->Entry);
  std::__cxx11::string::string((string *)&this->Key,(string *)_entrywidth_local);
  this->LabelWidth = local_1c;
  this->EntryWidth = local_20;
  local_44._M_string_length._0_4_ = 1;
  local_44._4_4_ = 1;
  local_44._M_dataplus = (_Alloc_hider)0x1;
  local_44._1_3_ = 0;
  std::make_unique<cmCursesLabelWidget,int&,int,int,int,std::__cxx11::string_const&>
            ((int *)((long)&local_44._M_string_length + 4),&this->LabelWidth,
             (int *)&local_44._M_string_length,(int *)&local_44.field_0x4,&local_44);
  this_00 = (unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_> *)
            ((long)&local_44._M_string_length + 4);
  std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::operator=
            (&this->Label,this_00);
  std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::~unique_ptr
            (this_00);
  local_5c[2] = 1;
  local_5c[1] = 1;
  local_5c[0] = 1;
  local_60[0] = '\x01';
  local_60[1] = '\0';
  local_60[2] = '\0';
  local_60[3] = '\0';
  std::make_unique<cmCursesLabelWidget,int,int,int,int,char_const(&)[2]>
            ((int *)&local_50,local_5c + 2,local_5c + 1,local_5c,(char (*) [2])local_60);
  std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::operator=
            (&this->IsNewLabel,&local_50);
  std::unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>::~unique_ptr
            (&local_50);
  local_70[1] = 1;
  local_70[0] = 1;
  std::make_unique<cmCursesStringWidget,int&,int,int,int>
            ((int *)&local_68,&this->EntryWidth,local_70 + 1,local_70);
  std::unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>>::operator=
            ((unique_ptr<cmCursesWidget,std::default_delete<cmCursesWidget>> *)&this->Entry,
             &local_68);
  std::unique_ptr<cmCursesStringWidget,_std::default_delete<cmCursesStringWidget>_>::~unique_ptr
            (&local_68);
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, int labelwidth, int entrywidth)
  : Key(key)
  , LabelWidth(labelwidth)
  , EntryWidth(entrywidth)
{
  this->Label =
    cm::make_unique<cmCursesLabelWidget>(this->LabelWidth, 1, 1, 1, key);
  this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, " ");
  this->Entry =
    cm::make_unique<cmCursesStringWidget>(this->EntryWidth, 1, 1, 1);
}